

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_movcf_d(DisasContext_conflict6 *ctx,int fs,int fd,int cc,int tf)

{
  TCGContext_conflict6 *s;
  TCGTemp *pTVar1;
  TCGLabel *l;
  int32_t arg2;
  
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
  l = gen_new_label_mips64el(s);
  arg2 = 0x800000;
  if (cc != 0) {
    arg2 = 0x1000000 << ((byte)cc & 0x1f);
  }
  tcg_gen_andi_i32_mips64el(s,(TCGv_i32)((long)pTVar1 - (long)s),s->fpu_fcr31,arg2);
  tcg_gen_brcondi_i32_mips64el(s,(tf == 0) + TCG_COND_EQ,(TCGv_i32)((long)pTVar1 - (long)s),0,l);
  tcg_temp_free_internal_mips64el(s,pTVar1);
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  gen_load_fpr64(ctx,(TCGv_i64)((long)pTVar1 - (long)s),fs);
  gen_store_fpr64(ctx,(TCGv_i64)((long)pTVar1 - (long)s),fd);
  tcg_temp_free_internal_mips64el(s,pTVar1);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)l);
  return;
}

Assistant:

static inline void gen_movcf_d(DisasContext *ctx, int fs, int fd, int cc,
                               int tf)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int cond;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i64 fp0;
    TCGLabel *l1 = gen_new_label(tcg_ctx);

    if (tf) {
        cond = TCG_COND_EQ;
    } else {
        cond = TCG_COND_NE;
    }

    tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, 1 << get_fp_bit(cc));
    tcg_gen_brcondi_i32(tcg_ctx, cond, t0, 0, l1);
    tcg_temp_free_i32(tcg_ctx, t0);
    fp0 = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx, fp0, fs);
    gen_store_fpr64(ctx, fp0, fd);
    tcg_temp_free_i64(tcg_ctx, fp0);
    gen_set_label(tcg_ctx, l1);
}